

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

uint trap_oh_errors<unsigned_int>
               (qpdf_data qpdf,function<unsigned_int_()> *fallback,
               function<unsigned_int_(_qpdf_data_*)> *fn)

{
  size_t *psVar1;
  undefined1 this [8];
  uint uVar2;
  _Node *p_Var3;
  char *cstr;
  Pipeline *this_00;
  uint ret;
  undefined1 local_9c [4];
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  _Invoker_type p_Stack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int local_5c;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_98 = (undefined1  [8])local_9c;
  std::function<unsigned_int_(_qpdf_data_*)>::function
            ((function<unsigned_int_(_qpdf_data_*)> *)local_90,fn);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_58._M_unused._0_8_ = local_98;
  *(long *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_58._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_58._M_unused._0_8_ + 0x20) = p_Stack_78;
  if ((code *)local_90._16_8_ != (code *)0x0) {
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_90._0_8_;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = local_90._8_8_;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = local_90._16_8_;
    local_90._16_8_ = (code *)0x0;
    p_Stack_78 = (_Invoker_type)0x0;
  }
  pcStack_40 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar2 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((code *)local_90._16_8_ != (code *)0x0) {
    (*(code *)local_90._16_8_)
              ((function<unsigned_int_(_qpdf_data_*)> *)local_90,
               (function<unsigned_int_(_qpdf_data_*)> *)local_90,3);
  }
  if (1 < uVar2) {
    if (qpdf->silence_errors == false) {
      if (qpdf->oh_error_occurred == false) {
        local_70._M_allocated_capacity._0_4_ = 1;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_98,
                   (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_5c = 0;
        p_Var3 = std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
                 _M_create_node<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                           ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf->warnings,
                            (qpdf_error_code_e *)&local_70._M_allocated_capacity,(string *)local_98,
                            (char (*) [1])0x27fb68,&local_5c,
                            (char (*) [129])
                            "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                           );
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        psVar1 = &(qpdf->warnings).super__List_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_98 != (undefined1  [8])(local_90 + 8)) {
          operator_delete((void *)local_98,local_90._8_8_ + 1);
        }
        qpdf->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_98,SUB41(local_70._M_allocated_capacity._0_4_,0));
      this = local_98;
      cstr = (char *)(**(code **)(*(long *)(qpdf->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
      }
    }
    if ((fallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    local_9c = (undefined1  [4])(*fallback->_M_invoker)((_Any_data *)fallback);
  }
  return (uint)local_9c;
}

Assistant:

static RET
trap_oh_errors(qpdf_data qpdf, std::function<RET()> fallback, std::function<RET(qpdf_data)> fn)
{
    // Note: fallback is a function so we don't have to evaluate it unless needed. This is important
    // because sometimes the fallback creates an object.
    RET ret;
    QPDF_ERROR_CODE status = trap_errors(qpdf, [&ret, fn](qpdf_data q) { ret = fn(q); });
    if (status & QPDF_ERRORS) {
        if (!qpdf->silence_errors) {
            QTC::TC("qpdf", "qpdf-c warn about oh error", qpdf->oh_error_occurred ? 0 : 1);
            if (!qpdf->oh_error_occurred) {
                qpdf->warnings.emplace_back(
                    qpdf_e_internal,
                    qpdf->qpdf->getFilename(),
                    "",
                    0,
                    "C API function caught an exception that it isn't returning; please point the "
                    "application developer to ERROR HANDLING in qpdf-c.h");
                qpdf->oh_error_occurred = true;
            }
            *QPDFLogger::defaultLogger()->getError() << qpdf->error->what() << "\n";
        }
        return fallback();
    }
    return ret;
}